

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::LocalAccessChainConvertPass::ProcessImpl(LocalAccessChainConvertPass *this)

{
  bool bVar1;
  Op OVar2;
  Status b;
  Instruction *this_00;
  Module *this_01;
  reference func_00;
  Function *func;
  iterator __end2_1;
  iterator __begin2_1;
  Module *__range2_1;
  Status status;
  Instruction *ai;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  LocalAccessChainConvertPass *this_local;
  
  Pass::get_module((Pass *)this);
  Module::annotations((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&ai);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&ai), bVar1) {
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = opt::Instruction::opcode(this_00);
    if (OVar2 == OpGroupDecorate) {
      return SuccessWithoutChange;
    }
    InstructionList::iterator::operator++(&__end2);
  }
  bVar1 = AllExtensionsSupported(this);
  if (bVar1) {
    __range2_1._4_4_ = SuccessWithoutChange;
    this_01 = Pass::get_module((Pass *)this);
    join_0x00000010_0x00000000_ = Module::begin(this_01);
    _func = Module::end(this_01);
    while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end2_1.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
      func_00 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_1.iterator_
                          );
      b = ConvertLocalAccessChains(this,func_00);
      __range2_1._4_4_ = CombineStatus(__range2_1._4_4_,b);
      if (__range2_1._4_4_ == Failure) break;
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_1.iterator_);
    }
    this_local._4_4_ = __range2_1._4_4_;
  }
  else {
    this_local._4_4_ = SuccessWithoutChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status LocalAccessChainConvertPass::ProcessImpl() {
  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // Do not process if any disallowed extensions are enabled
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;

  // Process all functions in the module.
  Status status = Status::SuccessWithoutChange;
  for (Function& func : *get_module()) {
    status = CombineStatus(status, ConvertLocalAccessChains(&func));
    if (status == Status::Failure) {
      break;
    }
  }
  return status;
}